

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadSemaphorePosix.cpp
# Opt level: O0

void __thiscall IlmThread_3_4::Semaphore::post(Semaphore *this)

{
  int iVar1;
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  allocator<char> local_29;
  string local_28 [24];
  allocator<char> *in_stack_fffffffffffffff0;
  
  iVar1 = sem_post((sem_t *)(in_RDI + 8));
  if (iVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
    Iex_3_4::throwErrnoExc(local_28);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator(&local_29);
  }
  return;
}

Assistant:

void
Semaphore::post ()
{
    if (::sem_post (&_semaphore))
        IEX_NAMESPACE::throwErrnoExc (
            "Post operation on semaphore failed (%T).");
}